

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O1

void __thiscall
AllReduceSockets::AllReduceSockets
          (AllReduceSockets *this,string *pspan_server,size_t punique_id,size_t ptotal,size_t pnode)

{
  pointer pcVar1;
  
  (this->super_AllReduce).total = ptotal;
  (this->super_AllReduce).node = pnode;
  (this->super_AllReduce)._vptr_AllReduce = (_func_int **)&PTR__AllReduceSockets_002ee148;
  node_socks::node_socks(&this->socks);
  (this->span_server)._M_dataplus._M_p = (pointer)&(this->span_server).field_2;
  pcVar1 = (pspan_server->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->span_server,pcVar1,pcVar1 + pspan_server->_M_string_length);
  this->unique_id = punique_id;
  return;
}

Assistant:

AllReduceSockets(std::string pspan_server, const size_t punique_id, size_t ptotal, const size_t pnode)
      : AllReduce(ptotal, pnode), span_server(pspan_server), unique_id(punique_id)
  {
  }